

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesDispatch2<false,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (outSumSquaredDerivatives == (double *)0x0) {
    if ((long)*(int *)(this + 0x14) < 1) {
      dVar3 = 0.0;
    }
    else {
      auVar5 = ZEXT816(0);
      lVar2 = 0;
      do {
        auVar6._0_8_ = (double)(*(float *)(*(long *)(this + 0xf8) + lVar2 * 4) /
                               *(float *)(*(long *)(this + 0xf0) + lVar2 * 4));
        auVar6._8_8_ = 0;
        auVar4._0_8_ = (double)auVar5._0_4_;
        auVar4._8_8_ = auVar5._8_8_;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x78) + lVar2 * 8);
        auVar1 = vfmadd231sd_fma(auVar4,auVar6,auVar1);
        lVar2 = lVar2 + 1;
        auVar5._0_4_ = (float)auVar1._0_8_;
        auVar5._4_12_ = auVar1._4_12_;
      } while (*(int *)(this + 0x14) != lVar2);
      dVar3 = (double)auVar5._0_4_;
    }
    *outSumDerivatives = dVar3;
    return;
  }
  accumulateDerivativesImpl<false,true,true>
            (this,outDerivatives,outSumDerivatives,outSumSquaredDerivatives);
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}